

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

size_t __thiscall
capnp::_::PackedInputStream::tryRead
          (PackedInputStream *this,ArrayPtr<unsigned_char> dstArray,size_t minBytes)

{
  BufferedInputStream *pBVar1;
  InputStream *this_00;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  undefined4 extraout_var;
  size_t sVar5;
  uchar *puVar6;
  byte *pbVar7;
  ulong __n;
  uchar *puVar8;
  size_t __nbytes;
  uchar *extraout_RDX;
  byte *pbVar9;
  ArrayPtr<unsigned_char> AVar10;
  ArrayPtr<const_unsigned_char> AVar11;
  uchar *local_3c0;
  uchar *local_3b8;
  void *local_3a8;
  size_t inRemaining;
  Fault f_9;
  uint *local_388;
  undefined1 local_380 [8];
  DebugComparison<unsigned_int_&,_long> _kjCondition_9;
  uint runLength_1;
  Fault f_8;
  unsigned_long local_340;
  DebugExpression<unsigned_long> local_338;
  undefined1 local_330 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_8;
  Fault f_7;
  uint *local_2f8;
  undefined1 local_2f0 [8];
  DebugComparison<unsigned_int_&,_long> _kjCondition_7;
  uint runLength;
  Fault f_6;
  unsigned_long local_2b0;
  DebugExpression<unsigned_long> local_2a8;
  undefined1 local_2a0 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_6;
  bool isNonzero_7;
  bool isNonzero_6;
  bool isNonzero_5;
  bool isNonzero_4;
  bool isNonzero_3;
  bool isNonzero_2;
  bool isNonzero_1;
  bool isNonzero;
  Fault f_5;
  size_t local_260;
  DebugExpression<unsigned_long> local_258;
  undefined1 local_250 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_5;
  uchar *local_220;
  Fault local_218;
  Fault f_4;
  size_t local_208;
  DebugExpression<unsigned_long> local_200;
  undefined1 local_1f8 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_4;
  uchar *local_1c8;
  uint local_1bc;
  uint i;
  Fault f_3;
  size_t local_1a8;
  DebugExpression<unsigned_long> local_1a0;
  undefined1 local_198 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_3;
  uchar *local_168;
  Fault local_160;
  Fault f_2;
  ulong local_150;
  DebugExpression<unsigned_long> local_148;
  undefined1 local_140 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_2;
  byte *pbStack_110;
  uint8_t tag;
  uint8_t *in;
  ArrayPtr<const_unsigned_char> buffer;
  uint8_t *outMin;
  uint8_t *outEnd;
  uint8_t *out;
  Fault f_1;
  ulong local_d0;
  DebugExpression<unsigned_long> local_c8;
  undefined1 local_c0 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_1;
  Fault local_88;
  Fault f;
  ulong local_78;
  DebugExpression<unsigned_long> local_70;
  undefined1 local_68 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  uint8_t *dst;
  size_t maxBytes;
  size_t minBytes_local;
  PackedInputStream *this_local;
  ArrayPtr<unsigned_char> dstArray_local;
  
  dstArray_local.ptr = (uchar *)dstArray.size_;
  this_local = (PackedInputStream *)dstArray.ptr;
  sVar4 = kj::ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&this_local);
  _kjCondition._32_8_ = kj::ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&this_local);
  if (sVar4 == 0) {
    dstArray_local.size_ = 0;
  }
  else {
    local_78 = minBytes & 7;
    local_70 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_78);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_68,&local_70,
               (int *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_68);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[46]>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x29,FAILED,"minBytes % sizeof(word) == 0",
                 "_kjCondition,\"PackedInputStream reads must be word-aligned.\"",
                 (DebugComparison<unsigned_long,_int> *)local_68,
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal(&local_88);
    }
    local_d0 = sVar4 & 7;
    local_c8 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d0);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_c0,&local_c8,
               (int *)((long)&f_1.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[46]>
                ((Fault *)&out,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0x2a,FAILED,"maxBytes % sizeof(word) == 0",
                 "_kjCondition,\"PackedInputStream reads must be word-aligned.\"",
                 (DebugComparison<unsigned_long,_int> *)local_c0,
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal((Fault *)&out);
    }
    outEnd = (uint8_t *)_kjCondition._32_8_;
    puVar8 = (uchar *)(_kjCondition._32_8_ + sVar4);
    buffer.size_ = _kjCondition._32_8_ + minBytes;
    iVar3 = (*(this->inner->super_InputStream)._vptr_InputStream[4])();
    in = (uint8_t *)CONCAT44(extraout_var,iVar3);
    buffer.ptr = extraout_RDX;
    sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
    if (sVar5 == 0) {
      dstArray_local.size_ = 0;
    }
    else {
      pbStack_110 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
LAB_003803f4:
      do {
        local_150 = (long)outEnd - _kjCondition._32_8_ & 7;
        local_148 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_150);
        f_2.exception._4_4_ = 0;
        kj::_::DebugExpression<unsigned_long>::operator==
                  ((DebugComparison<unsigned_long,_int> *)local_140,&local_148,
                   (int *)((long)&f_2.exception + 4));
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_140);
        if (!bVar2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[46]>
                    (&local_160,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x45,FAILED,"(out - dst) % sizeof(word) == 0",
                     "_kjCondition,\"Output pointer should always be aligned here.\"",
                     (DebugComparison<unsigned_long,_int> *)local_140,
                     (char (*) [46])"Output pointer should always be aligned here.");
          kj::_::Debug::Fault::fatal(&local_160);
        }
        puVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if ((ulong)((long)puVar6 - (long)pbStack_110) < 10) {
          if (buffer.size_ <= outEnd) {
            pBVar1 = this->inner;
            puVar8 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar1->super_InputStream)._vptr_InputStream[3])
                      (pBVar1,(long)pbStack_110 - (long)puVar8);
            return (long)outEnd - _kjCondition._32_8_;
          }
          pbVar7 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if (pbVar7 == pbStack_110) {
            pBVar1 = this->inner;
            sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
            join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
            in = (uint8_t *)_kjCondition_3._32_8_;
            buffer.ptr = local_168;
            local_1a8 = kj::ArrayPtr<const_unsigned_char>::size
                                  ((ArrayPtr<const_unsigned_char> *)&in);
            local_1a0 = kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1a8);
            f_3.exception._4_4_ = 0;
            kj::_::DebugExpression<unsigned_long>::operator>
                      ((DebugComparison<unsigned_long,_int> *)local_198,&local_1a0,
                       (int *)((long)&f_3.exception + 4));
            bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_198);
            if (!bVar2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                        ((Fault *)&stack0xfffffffffffffe48,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,0x4f,FAILED,"buffer.size() > 0",
                         "_kjCondition,\"Premature end of packed input.\"",
                         (DebugComparison<unsigned_long,_int> *)local_198,
                         (char (*) [31])"Premature end of packed input.");
              dstArray_local.size_ = (long)outEnd - _kjCondition._32_8_;
              kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffe48);
              return dstArray_local.size_;
            }
            pbStack_110 = kj::ArrayPtr<const_unsigned_char>::begin
                                    ((ArrayPtr<const_unsigned_char> *)&in);
            goto LAB_003803f4;
          }
          _kjCondition_2._39_1_ = *pbStack_110;
          pbStack_110 = pbStack_110 + 1;
          for (local_1bc = 0; local_1bc < 8; local_1bc = local_1bc + 1) {
            if (((uint)(byte)_kjCondition_2._39_1_ & 1 << ((byte)local_1bc & 0x1f)) == 0) {
              *outEnd = '\0';
            }
            else {
              pbVar7 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
              if (pbVar7 == pbStack_110) {
                pBVar1 = this->inner;
                sVar5 = kj::ArrayPtr<const_unsigned_char>::size
                                  ((ArrayPtr<const_unsigned_char> *)&in);
                (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
                join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
                in = (uint8_t *)_kjCondition_4._32_8_;
                buffer.ptr = local_1c8;
                local_208 = kj::ArrayPtr<const_unsigned_char>::size
                                      ((ArrayPtr<const_unsigned_char> *)&in);
                local_200 = kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_208);
                f_4.exception._4_4_ = 0;
                kj::_::DebugExpression<unsigned_long>::operator>
                          ((DebugComparison<unsigned_long,_int> *)local_1f8,&local_200,
                           (int *)((long)&f_4.exception + 4));
                bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
                if (!bVar2) {
                  kj::_::Debug::Fault::
                  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                            (&local_218,
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                             ,0x5b,FAILED,"buffer.size() > 0",
                             "_kjCondition,\"Premature end of packed input.\"",
                             (DebugComparison<unsigned_long,_int> *)local_1f8,
                             (char (*) [31])"Premature end of packed input.");
                  dstArray_local.size_ = (long)outEnd - _kjCondition._32_8_;
                  kj::_::Debug::Fault::~Fault(&local_218);
                  return dstArray_local.size_;
                }
                pbStack_110 = kj::ArrayPtr<const_unsigned_char>::begin
                                        ((ArrayPtr<const_unsigned_char> *)&in);
              }
              *outEnd = *pbStack_110;
              pbStack_110 = pbStack_110 + 1;
            }
            outEnd = outEnd + 1;
          }
          pbVar7 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          if ((pbVar7 == pbStack_110) &&
             ((_kjCondition_2._39_1_ == '\0' || (_kjCondition_2._39_1_ == -1)))) {
            pBVar1 = this->inner;
            sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
            join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
            in = (uint8_t *)_kjCondition_5._32_8_;
            buffer.ptr = local_220;
            local_260 = kj::ArrayPtr<const_unsigned_char>::size
                                  ((ArrayPtr<const_unsigned_char> *)&in);
            local_258 = kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_260);
            f_5.exception._4_4_ = 0;
            kj::_::DebugExpression<unsigned_long>::operator>
                      ((DebugComparison<unsigned_long,_int> *)local_250,&local_258,
                       (int *)((long)&f_5.exception + 4));
            bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
            if (!bVar2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                        ((Fault *)&isNonzero_7,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                         ,100,FAILED,"buffer.size() > 0",
                         "_kjCondition,\"Premature end of packed input.\"",
                         (DebugComparison<unsigned_long,_int> *)local_250,
                         (char (*) [31])"Premature end of packed input.");
              dstArray_local.size_ = (long)outEnd - _kjCondition._32_8_;
              kj::_::Debug::Fault::~Fault((Fault *)&isNonzero_7);
              return dstArray_local.size_;
            }
            pbStack_110 = kj::ArrayPtr<const_unsigned_char>::begin
                                    ((ArrayPtr<const_unsigned_char> *)&in);
          }
        }
        else {
          pbVar7 = pbStack_110 + 1;
          _kjCondition_2._39_1_ = *pbStack_110;
          _kjCondition_6._39_1_ = (_kjCondition_2._39_1_ & 1) != 0;
          *outEnd = *pbVar7 & -_kjCondition_6._39_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._39_1_;
          _kjCondition_6._38_1_ = (_kjCondition_2._39_1_ & 2) != 0;
          outEnd[1] = *pbVar7 & -_kjCondition_6._38_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._38_1_;
          _kjCondition_6._37_1_ = (_kjCondition_2._39_1_ & 4) != 0;
          outEnd[2] = *pbVar7 & -_kjCondition_6._37_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._37_1_;
          _kjCondition_6._36_1_ = (_kjCondition_2._39_1_ & 8) != 0;
          outEnd[3] = *pbVar7 & -_kjCondition_6._36_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._36_1_;
          _kjCondition_6._35_1_ = (_kjCondition_2._39_1_ & 0x10) != 0;
          outEnd[4] = *pbVar7 & -_kjCondition_6._35_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._35_1_;
          _kjCondition_6._34_1_ = (_kjCondition_2._39_1_ & 0x20) != 0;
          outEnd[5] = *pbVar7 & -_kjCondition_6._34_1_;
          pbVar7 = pbVar7 + (int)(uint)(byte)_kjCondition_6._34_1_;
          _kjCondition_6._33_1_ = (_kjCondition_2._39_1_ & 0x40) != 0;
          pbVar9 = outEnd + 7;
          outEnd[6] = *pbVar7 & -_kjCondition_6._33_1_;
          _kjCondition_6.result = (_kjCondition_2._39_1_ & 0x80) != 0;
          outEnd = outEnd + 8;
          *pbVar9 = pbVar7[(int)(uint)(byte)_kjCondition_6._33_1_] & -_kjCondition_6.result;
          pbStack_110 = pbVar7 + (int)(uint)(byte)_kjCondition_6._33_1_ +
                        (int)(uint)_kjCondition_6.result;
        }
        if (_kjCondition_2._39_1_ == '\0') {
          puVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          local_2b0 = (long)puVar6 - (long)pbStack_110;
          local_2a8 = kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2b0);
          f_6.exception._4_4_ = 0;
          kj::_::DebugExpression<unsigned_long>::operator>
                    ((DebugComparison<unsigned_long,_int> *)local_2a0,&local_2a8,
                     (int *)((long)&f_6.exception + 4));
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
                      ((Fault *)&stack0xfffffffffffffd40,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x7c,FAILED,"BUFFER_REMAINING > 0",
                       "_kjCondition,\"Should always have non-empty buffer here.\"",
                       (DebugComparison<unsigned_long,_int> *)local_2a0,
                       (char (*) [42])"Should always have non-empty buffer here.");
            kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffd40);
          }
          _kjCondition_7._36_4_ = (uint)*pbStack_110 << 3;
          local_2f8 = (uint *)kj::_::DebugExpressionStart::operator<<
                                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                         (uint *)&_kjCondition_7.field_0x24);
          f_7.exception = (Exception *)(puVar8 + -(long)outEnd);
          kj::_::DebugExpression<unsigned_int&>::operator<=
                    ((DebugComparison<unsigned_int_&,_long> *)local_2f0,
                     (DebugExpression<unsigned_int&> *)&local_2f8,(long *)&f_7);
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f0);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                      ((Fault *)&_kjCondition_8.result,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x81,FAILED,"runLength <= outEnd - out",
                       "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                       (DebugComparison<unsigned_int_&,_long> *)local_2f0,
                       (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
            dstArray_local.size_ = (long)outEnd - _kjCondition._32_8_;
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_8.result);
            return dstArray_local.size_;
          }
          memset(outEnd,0,(ulong)(uint)_kjCondition_7._36_4_);
          outEnd = outEnd + (uint)_kjCondition_7._36_4_;
          pbStack_110 = pbStack_110 + 1;
        }
        else if (_kjCondition_2._39_1_ == -1) {
          puVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          local_340 = (long)puVar6 - (long)pbStack_110;
          local_338 = kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_340);
          f_8.exception._4_4_ = 0;
          kj::_::DebugExpression<unsigned_long>::operator>
                    ((DebugComparison<unsigned_long,_int> *)local_330,&local_338,
                     (int *)((long)&f_8.exception + 4));
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_330);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
                      ((Fault *)&stack0xfffffffffffffcb0,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x88,FAILED,"BUFFER_REMAINING > 0",
                       "_kjCondition,\"Should always have non-empty buffer here.\"",
                       (DebugComparison<unsigned_long,_int> *)local_330,
                       (char (*) [42])"Should always have non-empty buffer here.");
            kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffcb0);
          }
          pbVar7 = pbStack_110 + 1;
          _kjCondition_9._36_4_ = (uint)*pbStack_110 << 3;
          local_388 = (uint *)kj::_::DebugExpressionStart::operator<<
                                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                         (uint *)&_kjCondition_9.field_0x24);
          f_9.exception = (Exception *)(puVar8 + -(long)outEnd);
          kj::_::DebugExpression<unsigned_int&>::operator<=
                    ((DebugComparison<unsigned_int_&,_long> *)local_380,
                     (DebugExpression<unsigned_int&> *)&local_388,(long *)&f_9);
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_380);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,long>&,char_const(&)[56]>
                      ((Fault *)&inRemaining,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0x8d,FAILED,"runLength <= outEnd - out",
                       "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                       (DebugComparison<unsigned_int_&,_long> *)local_380,
                       (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
            dstArray_local.size_ = (long)outEnd - _kjCondition._32_8_;
            kj::_::Debug::Fault::~Fault((Fault *)&inRemaining);
            return dstArray_local.size_;
          }
          puVar6 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
          __n = (long)puVar6 - (long)pbVar7;
          if (__n < (uint)_kjCondition_9._36_4_) {
            memcpy(outEnd,pbVar7,__n);
            __nbytes = (uint)_kjCondition_9._36_4_ - __n;
            _kjCondition_9._36_4_ = SUB84(__nbytes,0);
            pBVar1 = this->inner;
            sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
            (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
            this_00 = &this->inner->super_InputStream;
            AVar10 = kj::arrayPtr<unsigned_char>(outEnd + __n,(ulong)(uint)_kjCondition_9._36_4_);
            local_3a8 = (void *)AVar10.size_;
            kj::InputStream::read(this_00,(int)AVar10.ptr,local_3a8,__nbytes);
            outEnd = outEnd + __n + (uint)_kjCondition_9._36_4_;
            if (outEnd == puVar8) {
              return sVar4;
            }
            AVar11 = kj::BufferedInputStream::getReadBuffer(this->inner);
            local_3c0 = AVar11.ptr;
            in = local_3c0;
            local_3b8 = (uchar *)AVar11.size_;
            buffer.ptr = local_3b8;
            pbStack_110 = kj::ArrayPtr<const_unsigned_char>::begin
                                    ((ArrayPtr<const_unsigned_char> *)&in);
            goto LAB_003803f4;
          }
          memcpy(outEnd,pbVar7,(ulong)(uint)_kjCondition_9._36_4_);
          outEnd = outEnd + (uint)_kjCondition_9._36_4_;
          pbStack_110 = pbVar7 + (uint)_kjCondition_9._36_4_;
        }
      } while (outEnd != puVar8);
      pBVar1 = this->inner;
      puVar8 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
      (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,(long)pbStack_110 - (long)puVar8);
      dstArray_local.size_ = sVar4;
    }
  }
  return dstArray_local.size_;
}

Assistant:

size_t PackedInputStream::tryRead(kj::ArrayPtr<byte> dstArray, size_t minBytes) {
  auto maxBytes = dstArray.size();
  uint8_t* const dst = dstArray.begin();
  if (maxBytes == 0) {
    return 0;
  }

  KJ_DREQUIRE(minBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");
  KJ_DREQUIRE(maxBytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  uint8_t* __restrict__ out = dst;
  uint8_t* const outEnd = dst + maxBytes;
  uint8_t* const outMin = dst + minBytes;

  kj::ArrayPtr<const byte> buffer = inner.tryGetReadBuffer();
  if (buffer.size() == 0) {
    return 0;
  }
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { \
    return out - dst; \
  } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

#define BUFFER_END (reinterpret_cast<const uint8_t*>(buffer.end()))
#define BUFFER_REMAINING ((size_t)(BUFFER_END - in))

  for (;;) {
    uint8_t tag;

    KJ_DASSERT((out - dst) % sizeof(word) == 0,
           "Output pointer should always be aligned here.");

    if (BUFFER_REMAINING < 10) {
      if (out >= outMin) {
        // We read at least the minimum amount, so go ahead and return.
        inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
        return out - dst;
      }

      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          *out++ = *in++;
        } else {
          *out++ = 0;
        }
      }

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      { \
         bool isNonzero = (tag & (1u << n)) != 0; \
         *out++ = *in & (-(int8_t)isNonzero); \
         in += isNonzero; \
      }

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }
      memset(out, 0, runLength);
      out += runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= outEnd - out,
                 "Packed input did not end cleanly on a segment boundary.") {
        return out - dst;
      }

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining >= runLength) {
        // Fast path.
        memcpy(out, in, runLength);
        out += runLength;
        in += runLength;
      } else {
        // Copy over the first buffer, then do one big read for the rest.
        memcpy(out, in, inRemaining);
        out += inRemaining;
        runLength -= inRemaining;

        inner.skip(buffer.size());
        inner.read(kj::arrayPtr(out, (size_t)runLength));
        out += runLength;

        if (out == outEnd) {
          return maxBytes;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (out == outEnd) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return maxBytes;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
  return 0;  // GCC knows KJ_FAIL_ASSERT doesn't return, but Eclipse CDT still warns...

#undef REFRESH_BUFFER
}